

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O2

string * __thiscall
MPL::detail::ModelPackageImpl::replaceRootModel
          (string *__return_storage_ptr__,ModelPackageImpl *this,path *path,string *name,
          string *author,string *description)

{
  JsonMap *pJVar1;
  bool bVar2;
  string rootModelIdentifier;
  allocator<char> local_79;
  string local_78;
  string *local_58;
  string local_50;
  
  pJVar1 = (this->m_manifest)._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>.
           _M_t.super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
           super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl;
  local_58 = description;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"rootModelIdentifier",(allocator<char> *)&local_50);
  bVar2 = JsonMap::hasKey(pJVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  if (bVar2) {
    pJVar1 = (this->m_manifest)._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>.
             _M_t.super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
             super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"rootModelIdentifier",&local_79);
    JsonMap::getString(&local_78,pJVar1,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    removeItem(this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  addItem(__return_storage_ptr__,this,path,name,author,local_58);
  pJVar1 = (this->m_manifest)._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>.
           _M_t.super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
           super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"rootModelIdentifier",(allocator<char> *)&local_50);
  JsonMap::setString(pJVar1,&local_78,__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string ModelPackageImpl::replaceRootModel(const std::filesystem::path& path, const std::string& name, const std::string& author, const std::string& description)
{
    if (m_manifest->hasKey(kModelPackageRootModelKey)) {
        auto rootModelIdentifier = m_manifest->getString(kModelPackageRootModelKey);
        removeItem(rootModelIdentifier);
    }
    
    auto identifier = addItem(path, name, author, description);
    m_manifest->setString(kModelPackageRootModelKey, identifier);
    return identifier;
}